

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.h
# Opt level: O2

void run_benchmark(char *name,_func_void_void_ptr_int *benchmark,_func_void_void_ptr *setup,
                  _func_void_void_ptr_int *teardown,void *data,int count,int iter)

{
  int64_t iVar1;
  int64_t iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  bool bVar8;
  
  lVar5 = 0x7fffffffffffffff;
  iVar6 = 10;
  lVar7 = 0;
  lVar3 = 0;
  while (bVar8 = iVar6 != 0, iVar6 = iVar6 + -1, bVar8) {
    if (setup != (_func_void_void_ptr *)0x0) {
      (*setup)(data);
    }
    iVar1 = gettime_i64();
    (*benchmark)(data,count);
    iVar2 = gettime_i64();
    if (teardown != (_func_void_void_ptr_int *)0x0) {
      (*teardown)(data,count);
    }
    lVar4 = iVar2 - iVar1;
    if (lVar4 < lVar5) {
      lVar5 = lVar4;
    }
    if (lVar3 < lVar4) {
      lVar3 = lVar4;
    }
    lVar7 = lVar7 + lVar4;
  }
  printf("%-30s, ",name);
  lVar4 = (long)count;
  print_number((lVar5 * 1000000) / lVar4);
  printf("   , ");
  print_number((lVar7 * 100000) / lVar4);
  printf("   , ");
  print_number((lVar3 * 1000000) / lVar4);
  putchar(10);
  return;
}

Assistant:

static void run_benchmark(char *name, void (*benchmark)(void*, int), void (*setup)(void*), void (*teardown)(void*, int), void* data, int count, int iter) {
    int i;
    int64_t min = INT64_MAX;
    int64_t sum = 0;
    int64_t max = 0;
    for (i = 0; i < count; i++) {
        int64_t begin, total;
        if (setup != NULL) {
            setup(data);
        }
        begin = gettime_i64();
        benchmark(data, iter);
        total = gettime_i64() - begin;
        if (teardown != NULL) {
            teardown(data, iter);
        }
        if (total < min) {
            min = total;
        }
        if (total > max) {
            max = total;
        }
        sum += total;
    }
    /* ',' is used as a column delimiter */
    printf("%-30s, ", name);
    print_number(min * FP_MULT / iter);
    printf("   , ");
    print_number(((sum * FP_MULT) / count) / iter);
    printf("   , ");
    print_number(max * FP_MULT / iter);
    printf("\n");
}